

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor_test.cc
# Opt level: O0

void __thiscall anon_unknown.dwarf_6acc::TENSOR_TO_INDEX_Test::TestBody(TENSOR_TO_INDEX_Test *this)

{
  array<unsigned_int,_3UL> size;
  bool bVar1;
  char *pcVar2;
  AssertHelper local_120;
  Message local_118;
  int local_10c;
  array<unsigned_int,_3UL> local_108;
  int local_fc;
  undefined1 local_f8 [8];
  AssertionResult gtest_ar_2;
  Message local_e0;
  int local_d4;
  array<unsigned_int,_3UL> local_d0;
  int local_c4;
  undefined1 local_c0 [8];
  AssertionResult gtest_ar_1;
  Message local_a8;
  int local_a0 [4];
  array<unsigned_int,_3UL> local_90;
  int local_84;
  undefined1 local_80 [8];
  AssertionResult gtest_ar;
  undefined1 local_50 [8];
  tensor<int,_3U> ts;
  TENSOR_TO_INDEX_Test *this_local;
  
  gtest_ar.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x300000002;
  size._M_elems[2] = 4;
  size._M_elems[0] = 2;
  size._M_elems[1] = 3;
  ts._56_8_ = this;
  dnet::data_types::tensor<int,_3U>::tensor((tensor<int,_3U> *)local_50,size);
  local_90._M_elems[0] = 0;
  local_90._M_elems[1] = 0;
  local_90._M_elems[2] = 2;
  local_84 = dnet::data_types::tensor<int,_3U>::to_index((tensor<int,_3U> *)local_50,&local_90);
  local_a0[0] = 2;
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_80,"ts.to_index({0,0,2})","12*0+4*0+1*2",&local_84,local_a0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_80);
  if (!bVar1) {
    testing::Message::Message(&local_a8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_80);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Linyxus[P]deeper-net/src/data_types/tensor_test.cc"
               ,0x42,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_80);
  local_d0._M_elems[0] = 0;
  local_d0._M_elems[1] = 1;
  local_d0._M_elems[2] = 2;
  local_c4 = dnet::data_types::tensor<int,_3U>::to_index((tensor<int,_3U> *)local_50,&local_d0);
  local_d4 = 6;
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_c0,"ts.to_index({0,1,2})","12*0+4*1+1*2",&local_c4,&local_d4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c0);
  if (!bVar1) {
    testing::Message::Message(&local_e0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Linyxus[P]deeper-net/src/data_types/tensor_test.cc"
               ,0x43,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c0);
  local_108._M_elems[0] = 1;
  local_108._M_elems[1] = 2;
  local_108._M_elems[2] = 3;
  local_fc = dnet::data_types::tensor<int,_3U>::to_index((tensor<int,_3U> *)local_50,&local_108);
  local_10c = 0x17;
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_f8,"ts.to_index({1,2,3})","12*1+4*2+1*3",&local_fc,&local_10c)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f8);
  if (!bVar1) {
    testing::Message::Message(&local_118);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_f8);
    testing::internal::AssertHelper::AssertHelper
              (&local_120,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Linyxus[P]deeper-net/src/data_types/tensor_test.cc"
               ,0x44,pcVar2);
    testing::internal::AssertHelper::operator=(&local_120,&local_118);
    testing::internal::AssertHelper::~AssertHelper(&local_120);
    testing::Message::~Message(&local_118);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f8);
  dnet::data_types::tensor<int,_3U>::~tensor((tensor<int,_3U> *)local_50);
  return;
}

Assistant:

TEST(TENSOR, TO_INDEX) {
        tensor<int, 3> ts({2,3,4});
        EXPECT_EQ(ts.to_index({0,0,2}), 12*0+4*0+1*2);
        EXPECT_EQ(ts.to_index({0,1,2}), 12*0+4*1+1*2);
        EXPECT_EQ(ts.to_index({1,2,3}), 12*1+4*2+1*3);
    }